

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::anon_unknown_5::WalletImpl::getNewDestination
          (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           *__return_storage_ptr__,WalletImpl *this,OutputType type,string *label)

{
  long lVar1;
  CWallet *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  string in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&stack0xffffffffffffffa8,
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x9e,false);
  this_00 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)label);
  CWallet::GetNewDestination(__return_storage_ptr__,this_00,type,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> getNewDestination(const OutputType type, const std::string& label) override
    {
        LOCK(m_wallet->cs_wallet);
        return m_wallet->GetNewDestination(type, label);
    }